

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void __thiscall file::file(file *this)

{
  long *local_40 [2];
  long local_30 [2];
  
  (this->typeName)._M_dataplus._M_p = (pointer)&(this->typeName).field_2;
  (this->typeName)._M_string_length = 0;
  (this->typeName).field_2._M_local_buf[0] = '\0';
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,'\b');
  std::__cxx11::string::operator=((string *)&this->typeName,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

file::file() {
    typeName = std::string(8, ' ');
}